

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O3

void connection_destroy_endpoint(ENDPOINT_HANDLE endpoint)

{
  CONNECTION_HANDLE pCVar1;
  uint32_t uVar2;
  ulong uVar3;
  ENDPOINT_INSTANCE **ppEVar4;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  long lVar5;
  ulong uVar6;
  
  if (endpoint == (ENDPOINT_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
               ,"connection_destroy_endpoint",0x7c5,1,"NULL endpoint");
    return;
  }
  pCVar1 = endpoint->connection;
  uVar3 = (ulong)pCVar1->endpoint_count;
  if (uVar3 != 0) {
    ppEVar4 = pCVar1->endpoints;
    lVar5 = 0;
    uVar6 = uVar3;
    do {
      if (*(ENDPOINT_HANDLE *)((long)ppEVar4 + lVar5) == endpoint) {
        if (pCVar1->endpoint_count == 1) {
          free(ppEVar4);
          pCVar1->endpoints = (ENDPOINT_INSTANCE **)0x0;
          uVar2 = 0;
        }
        else {
          if (uVar3 * 8 + -8 != lVar5) {
            if ((uint)(-uVar6 >> 0x3d) < 7) {
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                (*UNRECOVERED_JUMPTABLE)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                           ,"connection_destroy_endpoint",0x7ec,1,
                           "Cannot memmove endpoints, size:%zu",0xffffffffffffffff);
              }
            }
            else {
              memmove((void *)((long)ppEVar4 + lVar5),(void *)((long)ppEVar4 + lVar5 + 8),
                      (uVar3 * 8 - lVar5) - 8);
            }
          }
          uVar6 = (ulong)pCVar1->endpoint_count - 1 >> 0x3d;
          uVar3 = (ulong)pCVar1->endpoint_count * 8 - 8;
          if ((uVar6 == 0) &&
             (ppEVar4 = (ENDPOINT_INSTANCE **)realloc(pCVar1->endpoints,uVar3),
             ppEVar4 != (ENDPOINT_INSTANCE **)0x0)) {
            pCVar1->endpoints = ppEVar4;
          }
          else {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                         ,"connection_destroy_endpoint",0x7f5,1,"Memory realloc failed, size:%zu",
                         -(ulong)(uVar6 != 0) | uVar3);
            }
          }
          uVar2 = pCVar1->endpoint_count - 1;
        }
        pCVar1->endpoint_count = uVar2;
        break;
      }
      lVar5 = lVar5 + 8;
      uVar6 = uVar6 - 1;
    } while (uVar3 * 8 - lVar5 != 0);
  }
  free(endpoint);
  return;
}

Assistant:

void connection_destroy_endpoint(ENDPOINT_HANDLE endpoint)
{
    if (endpoint == NULL)
    {
        LogError("NULL endpoint");
    }
    else
    {
        CONNECTION_HANDLE connection = (CONNECTION_HANDLE)endpoint->connection;
        size_t i;

        for (i = 0; i < connection->endpoint_count; i++)
        {
            if (connection->endpoints[i] == endpoint)
            {
                break;
            }
        }

        /* Codes_S_R_S_CONNECTION_01_130: [The outgoing channel associated with the endpoint shall be released by removing the endpoint from the endpoint list.] */
        /* Codes_S_R_S_CONNECTION_01_131: [Any incoming channel number associated with the endpoint shall be released.] */
        if (i < connection->endpoint_count)
        {
            // endpoint found
            if (connection->endpoint_count == 1)
            {
                free(connection->endpoints);
                connection->endpoints = NULL;
                connection->endpoint_count = 0;
            }
            else
            {
                ENDPOINT_HANDLE* new_endpoints;
                size_t new_count = safe_subtract_size_t(safe_subtract_size_t(connection->endpoint_count, i), 1);
                if (new_count > 0)
                {
                    size_t memmove_size = safe_multiply_size_t(safe_subtract_size_t(safe_subtract_size_t(connection->endpoint_count, i), 1), sizeof(ENDPOINT_HANDLE));
                    if (memmove_size != SIZE_MAX)
                    {
                        (void)memmove(connection->endpoints + i, connection->endpoints + i + 1, memmove_size);
                    }
                    else
                    {
                        LogError("Cannot memmove endpoints, size:%zu", memmove_size);
                    }
                }

                size_t realloc_size = safe_subtract_size_t(connection->endpoint_count, 1);
                realloc_size = safe_multiply_size_t(realloc_size, sizeof(ENDPOINT_HANDLE));
                if (realloc_size == SIZE_MAX ||
                    (new_endpoints = (ENDPOINT_HANDLE*)realloc(connection->endpoints, realloc_size)) == NULL)
                {
                    LogError("Memory realloc failed, size:%zu", realloc_size);
                }
                else
                {
                    connection->endpoints = new_endpoints;
                }

                connection->endpoint_count--;
            }
        }

        free(endpoint);
    }
}